

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O1

void regularizer_to_weight<dense_parameters>(vw *param_1,bfgs *b,dense_parameters *weights)

{
  weight *pwVar1;
  uint32_t uVar2;
  long lVar3;
  ulong uVar4;
  
  if ((b->regularizers != (weight *)0x0) &&
     (pwVar1 = weights->_begin, pwVar1 != pwVar1 + weights->_weight_mask + 1)) {
    uVar2 = weights->_stride_shift;
    lVar3 = 0;
    do {
      uVar4 = (ulong)(lVar3 >> 2) >> ((byte)weights->_stride_shift & 0x3f);
      *(weight *)((long)pwVar1 + lVar3 + 0xc) = b->regularizers[uVar4 * 2];
      *(weight *)((long)pwVar1 + lVar3) = b->regularizers[uVar4 * 2 + 1];
      lVar3 = lVar3 + (1L << ((byte)uVar2 & 0x3f)) * 4;
    } while ((weight *)((long)pwVar1 + lVar3) != weights->_begin + weights->_weight_mask + 1);
  }
  return;
}

Assistant:

void regularizer_to_weight(vw& /* all */, bfgs& b, T& weights)
{
  if (b.regularizers != nullptr)
  {
    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      uint64_t i = w.index() >> weights.stride_shift();
      (&(*w))[W_COND] = b.regularizers[2 * i];
      *w = b.regularizers[2 * i + 1];
    }
  }
}